

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapParse.c
# Opt level: O2

void Amap_LibParseTest(char *pFileName)

{
  abctime aVar1;
  Amap_Lib_t *p;
  abctime aVar2;
  int level;
  
  aVar1 = Abc_Clock();
  p = Amap_LibReadFile(pFileName,0);
  if (p != (Amap_Lib_t *)0x0) {
    Amap_LibParseEquations(p,0);
    Amap_LibFree(p);
    level = (int)p;
    Abc_Print(level,"%s =","Total time");
    aVar2 = Abc_Clock();
    Abc_Print(level,"%9.2f sec\n",(double)(aVar2 - aVar1) / 1000000.0);
    return;
  }
  return;
}

Assistant:

void Amap_LibParseTest( char * pFileName )
{
    int fVerbose = 0;
    Amap_Lib_t * p;
    abctime clk = Abc_Clock();
    p = Amap_LibReadFile( pFileName, fVerbose );
    if ( p == NULL )
        return;
    Amap_LibParseEquations( p, fVerbose );
    Amap_LibFree( p );
    ABC_PRT( "Total time", Abc_Clock() - clk );
}